

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O0

monster_race * get_mon_num(wchar_t generated_level,wchar_t current_level)

{
  alloc_entry *table_00;
  _Bool _Var1;
  uint32_t uVar2;
  wchar_t wVar3;
  monster_race *pmVar4;
  uint local_4c;
  monster_race *old_1;
  monster_race *old;
  alloc_entry *table;
  monster_race *race;
  long total;
  wchar_t p;
  wchar_t i;
  wchar_t current_level_local;
  wchar_t generated_level_local;
  
  table_00 = alloc_race_table;
  i = generated_level;
  if ((L'\0' < generated_level) && (uVar2 = Rand_div((uint)z_info->ood_monster_chance), uVar2 == 0))
  {
    if ((int)(uint)z_info->ood_monster_amount < generated_level / 4 + 2) {
      local_4c = (uint)z_info->ood_monster_amount;
    }
    else {
      local_4c = generated_level / 4 + 2;
    }
    i = local_4c + generated_level;
  }
  race = (monster_race *)0x0;
  total._4_4_ = 0;
  while ((total._4_4_ < alloc_race_size && (table_00[total._4_4_].level <= i))) {
    table_00[total._4_4_].prob3 = 0;
    if ((i < L'\x01') || (0 < table_00[total._4_4_].level)) {
      pmVar4 = r_info + table_00[total._4_4_].index;
      _Var1 = get_mon_forbidden(pmVar4);
      if (!_Var1) {
        table_00[total._4_4_].prob3 = table_00[total._4_4_].prob2;
        wVar3 = get_mon_adjust(table_00[total._4_4_].prob3,pmVar4);
        table_00[total._4_4_].prob3 = wVar3;
        race = (monster_race *)(race->flags + (long)table_00[total._4_4_].prob3 + -0x5c);
      }
    }
    total._4_4_ = total._4_4_ + 1;
  }
  if ((long)race < 1) {
    _current_level_local = (monster_race *)0x0;
  }
  else {
    pmVar4 = get_mon_race_aux((long)race,table_00);
    uVar2 = Rand_div(100);
    table = (alloc_entry *)pmVar4;
    if (((int)uVar2 < 0x3c) &&
       (table = (alloc_entry *)get_mon_race_aux((long)race,table_00),
       ((monster_race *)table)->level < pmVar4->level)) {
      table = (alloc_entry *)pmVar4;
    }
    pmVar4 = (monster_race *)table;
    if (((int)uVar2 < 10) &&
       (pmVar4 = get_mon_race_aux((long)race,table_00), pmVar4->level < table[6].prob1)) {
      pmVar4 = (monster_race *)table;
    }
    table = (alloc_entry *)pmVar4;
    _current_level_local = (monster_race *)table;
  }
  return _current_level_local;
}

Assistant:

struct monster_race *get_mon_num(int generated_level, int current_level)
{
	int i, p;
	long total;
	struct monster_race *race;
	alloc_entry *table = alloc_race_table;

	/* Occasionally produce a nastier monster in the dungeon */
	if (generated_level > 0 && one_in_(z_info->ood_monster_chance))
		generated_level += MIN(generated_level / 4 + 2,
			z_info->ood_monster_amount);

	total = 0L;

	/* Process probabilities */
	for (i = 0; i < alloc_race_size; i++) {
		/* Monsters are sorted by depth */
		if (table[i].level > generated_level) break;

		/* Default */
		table[i].prob3 = 0;

		/* No town monsters in dungeon */
		if (generated_level > 0 && table[i].level <= 0) continue;

		/* Get the chosen monster */
		race = &r_info[table[i].index];

		/* Some monsters will not be allowed on the current level */
		if (get_mon_forbidden(race)) continue;

		/* Accept */
		table[i].prob3 = table[i].prob2;

		/* Adjust for locality and topography */
		table[i].prob3 = get_mon_adjust(table[i].prob3, race);

		/* Total */
		total += table[i].prob3;
	}

	/* No legal monsters */
	if (total <= 0) return NULL;

	/* Pick a monster */
	race = get_mon_race_aux(total, table);

	/* Try for a "harder" monster once (50%) or twice (10%) */
	p = randint0(100);

	if (p < 60) {
		struct monster_race *old = race;

		/* Pick a new monster */
		race = get_mon_race_aux(total, table);

		/* Keep the deepest one */
		if (race->level < old->level) race = old;
	}

	/* Try for a "harder" monster twice (10%) */
	if (p < 10) {
		struct monster_race *old = race;

		/* Pick a monster */
		race = get_mon_race_aux(total, table);

		/* Keep the deepest one */
		if (race->level < old->level) race = old;
	}

	/* Result */
	return race;
}